

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  ImDrawList *pIVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  void *pvVar11;
  char *pcVar12;
  char *text;
  ImFontGlyph *pIVar13;
  ImDrawIdx IVar14;
  float scale;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint c;
  float local_a4;
  uint local_90;
  ImU32 local_8c;
  undefined1 local_88 [16];
  ulong local_70;
  ImDrawIdx *local_68;
  ImDrawVert *local_60;
  uint local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  ImDrawList *local_38;
  
  local_8c = col;
  local_38 = draw_list;
  if (text_end == (char *)0x0) {
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
  }
  fVar15 = (float)(int)pos->y;
  local_88 = ZEXT416((uint)fVar15);
  if (fVar15 < clip_rect->w || fVar15 == clip_rect->w) {
    _local_48 = ZEXT416((uint)pos->x);
    scale = size / this->FontSize;
    fVar16 = this->FontSize * scale;
    fVar15 = fVar15 + fVar16;
    if ((fVar15 < clip_rect->y) && (text_begin < text_end && fVar15 < clip_rect->y)) {
      do {
        local_88 = ZEXT416((uint)fVar15);
        pcVar9 = (char *)memchr(text_begin,10,(long)text_end - (long)text_begin);
        if (wrap_width <= 0.0) {
          text_begin = pcVar9 + 1;
          if (pcVar9 == (char *)0x0) {
            text_begin = text_end;
          }
        }
        else {
          pcVar10 = CalcWordWrapPositionA(this,scale,text_begin,pcVar9,wrap_width);
          pcVar9 = pcVar10;
          if (pcVar10 < text_end) {
            do {
              if ((*pcVar10 != ' ') && (pcVar9 = pcVar10, *pcVar10 != '\t')) break;
              pcVar10 = pcVar10 + 1;
              pcVar9 = text_end;
            } while (pcVar10 != text_end);
          }
          text_begin = pcVar9 + (*pcVar9 == '\n');
        }
        fVar15 = fVar16 + (float)local_88._0_4_;
      } while ((fVar15 < clip_rect->y) && (text_begin < text_end));
    }
    pcVar9 = text_end;
    if ((wrap_width <= 0.0) && (10000 < (long)text_end - (long)text_begin)) {
      fVar15 = clip_rect->w;
      pcVar9 = text_begin;
      fVar17 = (float)local_88._0_4_;
      while ((fVar17 < fVar15 && (pcVar9 < text_end))) {
        pvVar11 = memchr(pcVar9,10,(long)text_end - (long)pcVar9);
        pcVar9 = (char *)((long)pvVar11 + 1);
        if (pvVar11 == (void *)0x0) {
          pcVar9 = text_end;
        }
        fVar17 = fVar17 + fVar16;
      }
    }
    pIVar6 = local_38;
    if (text_begin != pcVar9) {
      local_48._4_4_ = (float)(int)(float)local_48._4_4_;
      local_48._0_4_ = (float)(int)(float)local_48._0_4_;
      fStack_40 = (float)(int)fStack_40;
      fStack_3c = (float)(int)fStack_3c;
      iVar7 = (int)pcVar9 - (int)text_begin;
      local_50 = iVar7 * 6;
      local_4c = (local_38->IdxBuffer).Size;
      ImDrawList::PrimReserve(local_38,local_50,iVar7 * 4);
      local_60 = pIVar6->_VtxWritePtr;
      local_68 = pIVar6->_IdxWritePtr;
      local_70 = (ulong)pIVar6->_VtxCurrentIdx;
      local_54 = local_8c | 0xffffff;
      pcVar10 = (char *)0x0;
      local_a4 = (float)local_48._0_4_;
      fVar15 = (float)local_48._0_4_;
      do {
        if (pcVar9 <= text_begin) break;
        pcVar12 = pcVar10;
        text = text_begin;
        fVar17 = (float)local_88._0_4_;
        uVar18 = local_88._4_4_;
        uVar19 = local_88._8_4_;
        uVar20 = local_88._12_4_;
        fVar21 = local_a4;
        while (0.0 < wrap_width) {
          if (pcVar12 == (char *)0x0) {
            pcVar12 = CalcWordWrapPositionA(this,scale,text,pcVar9,(fVar15 - fVar21) + wrap_width);
            uVar18 = 0;
            uVar19 = 0;
            uVar20 = 0;
            fVar15 = (float)local_48._0_4_;
          }
          if (text < pcVar12) {
            local_88._4_4_ = uVar18;
            local_88._0_4_ = fVar17;
            local_88._8_4_ = uVar19;
            local_88._12_4_ = uVar20;
            pcVar10 = pcVar12;
            text_begin = text;
            local_a4 = fVar21;
            break;
          }
          fVar17 = fVar17 + fVar16;
          do {
            if ((*text != ' ') && (pcVar12 = text, *text != '\t')) break;
            text = text + 1;
            pcVar12 = pcVar9;
          } while (text != pcVar9);
          text = pcVar12 + (*pcVar12 == '\n');
          pcVar12 = (char *)0x0;
          fVar21 = fVar15;
          if (pcVar9 <= text) goto LAB_00207f64;
        }
        local_90 = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar7 = ImTextCharFromUtf8(&local_90,text_begin,pcVar9);
          text_begin = text_begin + iVar7;
          fVar15 = (float)local_48._0_4_;
          if (local_90 != 0) goto LAB_00207c38;
          bVar4 = true;
        }
        else {
          text_begin = text_begin + 1;
LAB_00207c38:
          if (local_90 < 0x20) {
            if (local_90 != 0xd) {
              if (local_90 == 10) {
                local_88._0_4_ = (float)local_88._0_4_ + fVar16;
                bVar4 = clip_rect->w <= (float)local_88._0_4_ &&
                        (float)local_88._0_4_ != clip_rect->w;
                local_a4 = fVar15;
                goto LAB_00207f48;
              }
              goto LAB_00207c78;
            }
          }
          else {
LAB_00207c78:
            if (((local_90 & 0xffff) < (uint)(this->IndexLookup).Size) &&
               (uVar3 = (this->IndexLookup).Data[(ushort)local_90], uVar3 != 0xffff)) {
              pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
            }
            else {
              pIVar13 = this->FallbackGlyph;
            }
            if (pIVar13 != (ImFontGlyph *)0x0) {
              fVar17 = pIVar13->AdvanceX * scale;
              if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x2) == (undefined1  [40])0x0) {
LAB_00207f3c:
                local_a4 = local_a4 + fVar17;
              }
              else {
                fVar27 = pIVar13->X0 * scale + local_a4;
                fVar21 = clip_rect->z;
                bVar4 = true;
                if (fVar27 <= fVar21) {
                  fVar28 = pIVar13->X1 * scale + local_a4;
                  fVar2 = clip_rect->x;
                  if (fVar2 <= fVar28) {
                    fVar29 = pIVar13->Y0 * scale + (float)local_88._0_4_;
                    fVar24 = pIVar13->Y1 * scale + (float)local_88._0_4_;
                    fVar22 = pIVar13->U0;
                    fVar26 = pIVar13->V0;
                    fVar25 = pIVar13->U1;
                    fVar23 = pIVar13->V1;
                    if (cpu_fine_clip) {
                      if (fVar27 < fVar2) {
                        fVar22 = fVar22 + (fVar25 - fVar22) *
                                          (1.0 - (fVar28 - fVar2) / (fVar28 - fVar27));
                        fVar27 = fVar2;
                      }
                      fVar2 = clip_rect->y;
                      if (fVar29 < fVar2) {
                        fVar26 = fVar26 + (fVar23 - fVar26) *
                                          (1.0 - (fVar24 - fVar2) / (fVar24 - fVar29));
                        fVar29 = fVar2;
                      }
                      if (fVar21 < fVar28) {
                        fVar25 = (fVar25 - fVar22) * ((fVar21 - fVar27) / (fVar28 - fVar27)) +
                                 fVar22;
                        fVar28 = fVar21;
                      }
                      fVar21 = clip_rect->w;
                      if (fVar21 < fVar24) {
                        fVar23 = (fVar23 - fVar26) * ((fVar21 - fVar29) / (fVar24 - fVar29)) +
                                 fVar26;
                        fVar24 = fVar21;
                      }
                      if (fVar24 <= fVar29) {
                        local_a4 = local_a4 + fVar17;
                        bVar4 = false;
                        goto LAB_00207f38;
                      }
                    }
                    uVar5 = local_54;
                    if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x1) ==
                        (undefined1  [40])0x0) {
                      uVar5 = local_8c;
                    }
                    IVar14 = (ImDrawIdx)local_70;
                    *local_68 = IVar14;
                    local_68[1] = IVar14 + 1;
                    local_68[2] = IVar14 + 2;
                    local_68[3] = IVar14;
                    local_68[4] = IVar14 + 2;
                    local_68[5] = IVar14 + 3;
                    (local_60->pos).x = fVar27;
                    (local_60->pos).y = fVar29;
                    local_60->col = uVar5;
                    (local_60->uv).x = fVar22;
                    (local_60->uv).y = fVar26;
                    local_60[1].pos.x = fVar28;
                    local_60[1].pos.y = fVar29;
                    local_60[1].col = uVar5;
                    local_60[1].uv.x = fVar25;
                    local_60[1].uv.y = fVar26;
                    local_60[2].pos.x = fVar28;
                    local_60[2].pos.y = fVar24;
                    local_60[2].col = uVar5;
                    local_60[2].uv.x = fVar25;
                    local_60[2].uv.y = fVar23;
                    local_60[3].pos.x = fVar27;
                    local_60[3].pos.y = fVar24;
                    local_60[3].col = uVar5;
                    local_60[3].uv.x = fVar22;
                    local_60[3].uv.y = fVar23;
                    local_60 = local_60 + 4;
                    local_70 = (ulong)((int)local_70 + 4);
                    local_68 = local_68 + 6;
                  }
                }
LAB_00207f38:
                if (bVar4) goto LAB_00207f3c;
              }
              bVar4 = false;
              goto LAB_00207f48;
            }
          }
          bVar4 = false;
        }
LAB_00207f48:
      } while (!bVar4);
LAB_00207f64:
      (local_38->VtxBuffer).Size =
           (int)((ulong)((long)local_60 - (long)(local_38->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar7 = (int)((ulong)((long)local_68 - (long)(local_38->IdxBuffer).Data) >> 1);
      (local_38->IdxBuffer).Size = iVar7;
      puVar1 = &(local_38->CmdBuffer).Data[(long)(local_38->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar7 - (local_4c + local_50));
      local_38->_VtxWritePtr = local_60;
      local_38->_IdxWritePtr = local_68;
      local_38->_VtxCurrentIdx = (uint)local_70;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            const char* line_end = (const char*)memchr(s, '\n', text_end - s);
            if (word_wrap_enabled)
            {
                // FIXME-OPT: This is not optimal as do first do a search for \n before calling CalcWordWrapPositionA().
                // If the specs for CalcWordWrapPositionA() were reworked to optionally return on \n we could combine both.
                // However it is still better than nothing performing the fast-forward!
                s = CalcWordWrapPositionA(scale, s, line_end, wrap_width);
                s = CalcWordWrapNextLineStartA(s, text_end);
            }
            else
            {
                s = line_end ? line_end + 1 : text_end;
            }
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;
    const char* word_wrap_eol = NULL;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}